

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sub.c
# Opt level: O0

int sub0_ctx_unsubscribe(sub0_ctx *ctx,void *buf,size_t sz)

{
  void *ctx_00;
  _Bool _Var1;
  int iVar2;
  uint8_t *body;
  size_t len_00;
  nni_msg *local_50;
  nni_msg *msg;
  size_t i;
  size_t len;
  sub0_topic *topic;
  sub0_sock *sock;
  size_t sz_local;
  void *buf_local;
  sub0_ctx *ctx_local;
  
  topic = (sub0_topic *)ctx->sock;
  sock = (sub0_sock *)sz;
  sz_local = (size_t)buf;
  buf_local = ctx;
  nni_mtx_lock(&((sub0_sock *)topic)->lk);
  len = (size_t)nni_list_first((nni_list *)((long)buf_local + 0x18));
  while ((len != 0 &&
         ((*(sub0_sock **)(len + 0x10) != sock ||
          (iVar2 = memcmp(*(void **)(len + 0x18),(void *)sz_local,(size_t)sock), iVar2 != 0))))) {
    len = (size_t)nni_list_next((nni_list *)((long)buf_local + 0x18),(void *)len);
  }
  if (len == 0) {
    nni_mtx_unlock((nni_mtx *)&topic[6].buf);
    ctx_local._4_4_ = 0xc;
  }
  else {
    nni_list_remove((nni_list *)((long)buf_local + 0x18),(void *)len);
    i = nni_lmq_len((nni_lmq *)((long)buf_local + 0x48));
    for (msg = (nni_msg *)0x0; msg < i; msg = (nni_msg *)((long)msg->m_header_buf + 1)) {
      nni_lmq_get((nni_lmq *)((long)buf_local + 0x48),&local_50);
      ctx_00 = buf_local;
      body = (uint8_t *)nni_msg_body(local_50);
      len_00 = nni_msg_len(local_50);
      _Var1 = sub0_matches((sub0_ctx *)ctx_00,body,len_00);
      if (_Var1) {
        nni_lmq_put((nni_lmq *)((long)buf_local + 0x48),local_50);
      }
      else {
        nni_msg_free(local_50);
      }
    }
    nni_mtx_unlock((nni_mtx *)&topic[6].buf);
    nni_free(*(void **)(len + 0x18),*(size_t *)(len + 0x10));
    nni_free((void *)len,0x20);
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

static int
sub0_ctx_unsubscribe(sub0_ctx *ctx, const void *buf, size_t sz)
{
	sub0_sock  *sock = ctx->sock;
	sub0_topic *topic;
	size_t      len;

	nni_mtx_lock(&sock->lk);
	NNI_LIST_FOREACH (&ctx->topics, topic) {
		if (topic->len != sz) {
			continue;
		}
		if (memcmp(topic->buf, buf, sz) == 0) {
			// Matched!
			break;
		}
	}
	if (topic == NULL) {
		nni_mtx_unlock(&sock->lk);
		return (NNG_ENOENT);
	}
	nni_list_remove(&ctx->topics, topic);

	// Now we need to make sure that any messages that are waiting still
	// match the subscription.  We basically just run through the queue
	// and requeue those messages we need.
	len = nni_lmq_len(&ctx->lmq);
	for (size_t i = 0; i < len; i++) {
		nni_msg *msg;

		(void) nni_lmq_get(&ctx->lmq, &msg);
		if (sub0_matches(ctx, nni_msg_body(msg), nni_msg_len(msg))) {
			(void) nni_lmq_put(&ctx->lmq, msg);
		} else {
			nni_msg_free(msg);
		}
	}
	nni_mtx_unlock(&sock->lk);

	nni_free(topic->buf, topic->len);
	NNI_FREE_STRUCT(topic);
	return (0);
}